

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O2

void duckdb_je_inspect_extent_util_stats_verbose_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size,size_t *bin_nfree,
               size_t *bin_nregs,void **slabcur_addr)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *mutex;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  edata_t *peVar7;
  void *pvVar8;
  uint uVar9;
  rtree_t *rtree;
  size_t *psVar10;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1c8;
  
  psVar10 = size;
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,(uintptr_t)psVar10);
  if (local_1c8.edata == (edata_t *)0x0) {
    *bin_nregs = 0;
    *bin_nfree = 0;
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = ((local_1c8.edata)->field_2).e_size_esn & 0xfffffffffffff000;
    if (((uint)(local_1c8.edata)->e_bits >> 0xc & 1) != 0) {
      *nfree = (ulong)((uint)((local_1c8.edata)->e_bits >> 0x1c) & 0x3ff);
      uVar9 = (uint)(local_1c8.edata)->e_bits >> 0x14 & 0xff;
      *nregs = (ulong)duckdb_je_bin_infos[uVar9].nregs;
      uVar3 = (uint)((local_1c8.edata)->e_bits >> 0x26) & 0x3f;
      uVar5 = (ulong)(uVar3 << 8);
      if (uVar9 < duckdb_je_bin_info_nbatched_sizes) {
        uVar5 = (ulong)uVar3 * 0x288;
      }
      mutex = (malloc_mutex_t *)
              ((long)duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr +
              uVar5 + duckdb_je_arena_bin_offsets[uVar9]);
      __mutex = (pthread_mutex_t *)
                ((long)duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr +
                uVar5 + duckdb_je_arena_bin_offsets[uVar9] + 0x48);
      iVar4 = pthread_mutex_trylock(__mutex);
      if (iVar4 != 0) {
        duckdb_je_malloc_mutex_lock_slow(mutex);
        (mutex->field_0).field_0.locked.repr = true;
      }
      puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
        (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
        ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      sVar6 = *(long *)((long)&mutex[1].field_0 + 0x40) * *nregs;
      *bin_nregs = sVar6;
      *bin_nfree = sVar6 - (long)mutex[1].field_0.witness.opaque;
      peVar7 = (edata_t *)mutex[2].field_0.witness.name;
      if ((peVar7 == (edata_t *)0x0) &&
         (peVar7 = duckdb_je_edata_heap_first
                             ((edata_heap_t *)&mutex[2].field_0.field_0.prof_data.max_wait_time),
         peVar7 == (edata_t *)0x0)) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = peVar7->e_addr;
      }
      *slabcur_addr = pvVar8;
      (mutex->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      return;
    }
    *bin_nregs = 0;
    *bin_nfree = 0;
    *nfree = 0;
    *nregs = 1;
  }
  *slabcur_addr = (void *)0x0;
  return;
}

Assistant:

void
inspect_extent_util_stats_verbose_get(tsdn_t *tsdn, const void *ptr,
    size_t *nfree, size_t *nregs, size_t *size, size_t *bin_nfree,
    size_t *bin_nregs, void **slabcur_addr) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL
	    && bin_nfree != NULL && bin_nregs != NULL && slabcur_addr != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = *bin_nfree = *bin_nregs = 0;
		*slabcur_addr = NULL;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = *bin_nfree = *bin_nregs = 0;
		*nregs = 1;
		*slabcur_addr = NULL;
		return;
	}

	*nfree = edata_nfree_get(edata);
	const szind_t szind = edata_szind_get(edata);
	*nregs = bin_infos[szind].nregs;
	assert(*nfree <= *nregs);
	assert(*nfree * edata_usize_get(edata) <= *size);

	arena_t *arena = (arena_t *)atomic_load_p(
	    &arenas[edata_arena_ind_get(edata)], ATOMIC_RELAXED);
	assert(arena != NULL);
	const unsigned binshard = edata_binshard_get(edata);
	bin_t *bin = arena_get_bin(arena, szind, binshard);

	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		*bin_nregs = *nregs * bin->stats.curslabs;
		assert(*bin_nregs >= bin->stats.curregs);
		*bin_nfree = *bin_nregs - bin->stats.curregs;
	} else {
		*bin_nfree = *bin_nregs = 0;
	}
	edata_t *slab;
	if (bin->slabcur != NULL) {
		slab = bin->slabcur;
	} else {
		slab = edata_heap_first(&bin->slabs_nonfull);
	}
	*slabcur_addr = slab != NULL ? edata_addr_get(slab) : NULL;
	malloc_mutex_unlock(tsdn, &bin->lock);
}